

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenu::internalDelayedPopup(QMenu *this)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  QMenu *pQVar5;
  QObject *pQVar6;
  QGraphicsProxyWidget *pQVar7;
  QScreen *screen;
  QStyle *pQVar8;
  Representation RVar9;
  int iVar10;
  long in_FS_OFFSET;
  QRect QVar11;
  QRect QVar12;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 local_68 [8];
  QAction **local_60;
  long local_58;
  QPoint local_50;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  pDVar1 = (this_00->activeMenu).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      (pQVar6 = (this_00->activeMenu).wp.value, pQVar6 != (QObject *)0x0)) &&
     (*(QAction **)(*(long *)(pQVar6 + 8) + 0x3a8) != this_00->currentAction)) {
    QMenuPrivate::hideMenu(this_00,(QMenu *)pQVar6);
  }
  if (this_00->currentAction == (QAction *)0x0) goto LAB_00420a19;
  cVar2 = QAction::isEnabled();
  if (cVar2 == '\0') goto LAB_00420a19;
  pQVar5 = QAction::menu<QMenu*>(this_00->currentAction);
  if (pQVar5 == (QMenu *)0x0) goto LAB_00420a19;
  pQVar5 = QAction::menu<QMenu*>(this_00->currentAction);
  if ((((pQVar5->super_QWidget).data)->widget_attributes & 1) != 0) goto LAB_00420a19;
  pQVar5 = QAction::menu<QMenu*>(this_00->currentAction);
  if ((((pQVar5->super_QWidget).data)->widget_attributes & 0x8000) != 0) goto LAB_00420a19;
  pQVar6 = (QObject *)QAction::menu<QMenu*>(this_00->currentAction);
  QWeakPointer<QObject>::assign<QObject>(&(this_00->activeMenu).wp,pQVar6);
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)((this_00->activeMenu).wp.value + 8) + 0x2f8),
             (QObject *)this);
  QWeakPointer<QObject>::assign<QObject>
            ((QWeakPointer<QObject> *)(*(long *)((this_00->activeMenu).wp.value + 8) + 0x308),
             (QObject *)this_00->currentAction);
  bVar3 = bypassGraphicsProxyWidget(&this->super_QWidget);
  if (bVar3) {
LAB_00420881:
    local_68 = (undefined1  [8])QWidget::pos(&this->super_QWidget);
    screen = (QScreen *)QGuiApplication::screenAt((QPoint *)local_68);
  }
  else {
    pQVar7 = QWidgetPrivate::nearestGraphicsProxyWidget(&this->super_QWidget);
    if (pQVar7 == (QGraphicsProxyWidget *)0x0) goto LAB_00420881;
    screen = (QScreen *)0x0;
  }
  QVar11 = QMenuPrivate::popupGeometry(this_00,screen);
  pQVar8 = QWidget::style(&this->super_QWidget);
  iVar4 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x57,0,this);
  QVar12 = QMenuPrivate::actionRect(this_00,this_00->currentAction);
  local_48 = QVar12;
  bVar3 = QWidget::isRightToLeft(&this->super_QWidget);
  iVar10 = (QVar12.x1.m_i.m_i - iVar4) - QVar12.x2.m_i;
  if (!bVar3) {
    iVar10 = iVar4;
  }
  local_68._4_4_ = (int)QVar12.y1.m_i;
  local_68._0_4_ = iVar10 + QVar12.x2.m_i.m_i;
  local_50 = QWidget::mapToGlobal(&this->super_QWidget,(QPoint *)local_68);
  RVar9 = local_50.yp.m_i;
  if (QVar11.x2.m_i.m_i < local_50.xp.m_i.m_i) {
    local_50.yp.m_i = RVar9.m_i;
    local_50.xp.m_i = (((this->super_QWidget).data)->crect).x1.m_i;
  }
  QWidget::actions((QList<QAction_*> *)local_68,(QWidget *)(this_00->activeMenu).wp.value);
  if (local_58 != 0) {
    QVar11 = actionGeometry((QMenu *)(this_00->activeMenu).wp.value,*local_60);
    local_50.yp.m_i = RVar9.m_i - QVar11.y1.m_i;
  }
  pQVar6 = (QObject *)0x0;
  popup((QMenu *)(this_00->activeMenu).wp.value,&local_50,(QAction *)0x0);
  pDVar1 = (this_00->activeMenu).wp.d;
  if (pDVar1 != (Data *)0x0) {
    if (*(int *)(pDVar1 + 4) == 0) {
      pQVar6 = (QObject *)0x0;
    }
    else {
      pQVar6 = (this_00->activeMenu).wp.value;
    }
  }
  QMenuSloppyState::setSubMenuPopup
            (&this_00->sloppyState,&local_48,this_00->currentAction,(QMenu *)pQVar6);
  if ((((this->super_QWidget).data)->widget_attributes & 2) != 0) {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_78,Leave);
    QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_78);
    QEvent::~QEvent((QEvent *)&local_78);
  }
  QArrayDataPointer<QAction_*>::~QArrayDataPointer((QArrayDataPointer<QAction_*> *)local_68);
LAB_00420a19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::internalDelayedPopup()
{
    Q_D(QMenu);
    //hide the current item
    if (QMenu *menu = d->activeMenu) {
        if (d->activeMenu->menuAction() != d->currentAction)
            d->hideMenu(menu);
    }

    if (!d->currentAction || !d->currentAction->isEnabled() || !d->currentAction->menu() ||
        !d->currentAction->menu()->isEnabled() || d->currentAction->menu()->isVisible())
        return;

    //setup
    d->activeMenu = d->currentAction->menu();
    d->activeMenu->d_func()->causedPopup.widget = this;
    d->activeMenu->d_func()->causedPopup.action = d->currentAction;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(this) && QMenuPrivate::nearestGraphicsProxyWidget(this);
    if (isEmbedded)
        screen = d->popupGeometry();
    else
#endif
    screen = d->popupGeometry(QGuiApplication::screenAt(pos()));

    int subMenuOffset = style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, this);
    const QRect actionRect(d->actionRect(d->currentAction));
    const auto ofs = isRightToLeft() ? (-subMenuOffset - actionRect.width() + 1) : subMenuOffset;
    QPoint subMenuPos(mapToGlobal(QPoint(actionRect.right() + ofs, actionRect.top())));
    if (subMenuPos.x() > screen.right())
        subMenuPos.setX(geometry().left());

    const auto &subMenuActions = d->activeMenu->actions();
    if (!subMenuActions.isEmpty()) {
        // Offset by the submenu's 1st action position to align with the current action
        const auto subMenuActionRect = d->activeMenu->actionGeometry(subMenuActions.first());
        subMenuPos.ry() -= subMenuActionRect.top();
    }

    d->activeMenu->popup(subMenuPos);
    d->sloppyState.setSubMenuPopup(actionRect, d->currentAction, d->activeMenu);

#if !defined(Q_OS_DARWIN)
    // Send the leave event to the current menu - only active popup menu gets
    // mouse enter/leave events. Currently Cocoa is an exception, so disable
    // it there to avoid event duplication.
    if (underMouse()) {
        QEvent leaveEvent(QEvent::Leave);
        QCoreApplication::sendEvent(this, &leaveEvent);
    }
#endif
}